

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8 StringBuilder<unsigned_long>(unsigned_long *arg)

{
  undefined8 in_RDI;
  unsigned_long in_stack_00000028;
  
  std::__cxx11::to_string(in_stack_00000028);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg)
{
    return std::to_string(arg);
}